

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O2

void __thiscall ws::Record::add<int&>(Record *this,int *data)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,*data);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&this->message,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void add(T &&data)
    {
      using DataType = std::remove_cvref_t<T>;
      if constexpr (std::is_same_v<char, DataType>)
      {
        message += data;
      }
      else if constexpr (std::is_same_v<DataType, std::string>)
      {
        message += data;
      }
      else if constexpr (std::is_same_v<std::decay_t<DataType>, const char *>
                         || std::is_same_v<std::decay_t<DataType>, char *>
          )
      {
        message += data;
      }
      else
      {
        message += std::to_string(data);
      }
    }